

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# test-backend-ops.cpp
# Opt level: O2

ggml_tensor * __thiscall test_im2col::build_graph(test_im2col *this,ggml_context *ctx)

{
  ggml_tensor *pgVar1;
  ggml_tensor *pgVar2;
  
  pgVar1 = test_case::ggml_new_tensor
                     (&this->super_test_case,ctx,this->type_input,4,(this->ne_input)._M_elems);
  ggml_set_param(ctx,pgVar1);
  ggml_set_name(pgVar1,"input");
  pgVar2 = test_case::ggml_new_tensor
                     (&this->super_test_case,ctx,this->type_kernel,4,(this->ne_kernel)._M_elems);
  ggml_set_name(pgVar2,"kernel");
  pgVar1 = (ggml_tensor *)
           ggml_im2col(ctx,pgVar2,pgVar1,this->s0,this->s1,this->p0,this->p1,this->d0,this->d1,
                       this->is_2D,this->dst_type);
  ggml_set_name(pgVar1,"out");
  return pgVar1;
}

Assistant:

ggml_tensor * build_graph(ggml_context * ctx) override {
        ggml_tensor * input = ggml_new_tensor(ctx, type_input, 4, ne_input.data());
        ggml_set_param(ctx, input);
        ggml_set_name(input, "input");

        ggml_tensor * kernel = ggml_new_tensor(ctx, type_kernel, 4, ne_kernel.data());
        ggml_set_name(kernel, "kernel");

        ggml_tensor * out = ggml_im2col(ctx, kernel, input, s0, s1, p0, p1, d0, d1, is_2D, dst_type);
        ggml_set_name(out, "out");

        return out;
    }